

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libskiwi.cpp
# Opt level: O2

uint64_t __thiscall
skiwi::anon_unknown_1::compile_and_run
          (anon_unknown_1 *this,string *input,environment_map *env,repl_data *rd)

{
  uint64_t uVar1;
  fptr f;
  uint64_t size;
  
  f = compile(&size,(string *)this,env,rd);
  if (f == (fptr)0x0) {
    uVar1 = 0x27;
  }
  else {
    uVar1 = (*f)(&DAT_002b3720);
    std::
    vector<std::pair<unsigned_long(*)(void*,...),unsigned_long>,std::allocator<std::pair<unsigned_long(*)(void*,...),unsigned_long>>>
    ::emplace_back<unsigned_long(*&)(void*,___),unsigned_long&>
              ((vector<std::pair<unsigned_long(*)(void*,___),unsigned_long>,std::allocator<std::pair<unsigned_long(*)(void*,___),unsigned_long>>>
                *)&DAT_002b3920,(_func_unsigned_long_void_ptr_varargs **)&f,&size);
  }
  return uVar1;
}

Assistant:

uint64_t compile_and_run(const std::string& input, environment_map& env, repl_data& rd)
    {
    using namespace SKIWI;
    uint64_t result = skiwi_undefined;
    uint64_t size;
    auto f = compile(size, input, env, rd);
    if (f)
      {
#ifdef _SKIWI_FOR_ARM
      registers reg;
#ifdef _WIN32
      reg.rcx = (uint64_t)(&cd.ctxt);
#else
      reg.rdi = (uint64_t)(&cd.ctxt);
#endif

      run_bytecode(f, size, reg, cd.externals_for_vm);
      result = reg.rax;
      cd.compiled_bytecode.emplace_back(f, size);
#else
      result = f(&cd.ctxt);
      cd.compiled_functions.emplace_back(f, size);
#endif
      }
    return result;
    }